

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGridWrapC.cpp
# Opt level: O1

void tsgEvaluateSparseHierarchicalFunctions
               (void *grid,double *x,int num_x,int **pntr,int **indx,double **vals)

{
  int iVar1;
  int *piVar2;
  double *vals_00;
  
  iVar1 = TasGrid::TasmanianSparseGrid::evaluateSparseHierarchicalFunctionsGetNZ
                    ((TasmanianSparseGrid *)grid,x,num_x);
  piVar2 = (int *)malloc((long)num_x * 4 + 4);
  *pntr = piVar2;
  piVar2 = (int *)malloc((long)iVar1 * 4);
  *indx = piVar2;
  vals_00 = (double *)malloc((long)iVar1 << 3);
  *vals = vals_00;
  TasGrid::TasmanianSparseGrid::evaluateSparseHierarchicalFunctionsStatic
            ((TasmanianSparseGrid *)grid,x,num_x,*pntr,*indx,vals_00);
  return;
}

Assistant:

void tsgEvaluateSparseHierarchicalFunctions(void *grid, const double x[], int num_x, int **pntr, int **indx, double **vals){
    int num_nz = ((TasmanianSparseGrid*) grid)->evaluateSparseHierarchicalFunctionsGetNZ(x, num_x);
    *pntr = (int*) malloc((num_x+1) * sizeof(int));
    *indx = (int*) malloc(num_nz * sizeof(int));
    *vals = (double*) malloc(num_nz * sizeof(double));
    ((TasmanianSparseGrid*) grid)->evaluateSparseHierarchicalFunctionsStatic(x, num_x, *pntr, *indx, *vals);
}